

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_init_copy(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_digit *__s;
  
  __s = (mp_digit *)malloc(0x100);
  a->dp = __s;
  if (__s != (mp_digit *)0x0) {
    memset(__s,0,0x100);
    a->used = 0;
    a->alloc = 0x20;
    a->sign = 0;
    iVar1 = mp_copy(b,a);
    return iVar1;
  }
  return -2;
}

Assistant:

int mp_init_copy (mp_int * a, mp_int * b)
{
  int     res;

  if ((res = mp_init (a)) != MP_OKAY) {
    return res;
  }
  return mp_copy (b, a);
}